

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcs.cc
# Opt level: O2

int __thiscall dcs::Header::readFrom(Header *this,char *buf,size_t len)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  time_t tVar7;
  runtime_error *prVar8;
  ulong uVar9;
  int *in_R9;
  char local_8c [4];
  tm tm;
  
  if (len < 8) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_8c[0] = '7';
    local_8c[1] = '\0';
    local_8c[2] = '\0';
    local_8c[3] = '\0';
    util::str<char[42],char[85],char[2],int>
              ((string *)&tm,(util *)"Assertion `(len - nread) >= 8` failed at ",
               (char (*) [42])
               "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
               ,(char (*) [85])":",(char (*) [2])local_8c,in_R9);
    std::runtime_error::runtime_error(prVar8,(string *)&tm);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = __isoc99_sscanf(buf,"%08lx",this);
  if (iVar2 != 1) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_8c[0] = '9';
    local_8c[1] = '\0';
    local_8c[2] = '\0';
    local_8c[3] = '\0';
    util::str<char[31],char[85],char[2],int>
              ((string *)&tm,(util *)"Assertion `rv == 1` failed at ",
               (char (*) [31])
               "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
               ,(char (*) [85])":",(char (*) [2])local_8c,in_R9);
    std::runtime_error::runtime_error(prVar8,(string *)&tm);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0xfffffffffffffff4 < len - 0x13) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_8c[0] = 'A';
    local_8c[1] = '\0';
    local_8c[2] = '\0';
    local_8c[3] = '\0';
    util::str<char[42],char[85],char[2],int>
              ((string *)&tm,(util *)"Assertion `(len - nread) >= n` failed at ",
               (char (*) [42])
               "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
               ,(char (*) [85])":",(char (*) [2])local_8c,in_R9);
    std::runtime_error::runtime_error(prVar8,(string *)&tm);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tm._0_8_ = &tm.tm_mon;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tm,buf + 8,buf + 10);
  iVar2 = std::__cxx11::stoi((string *)&tm,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&tm);
  tm._0_8_ = &tm.tm_mon;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tm,buf + 10,buf + 0xd);
  iVar3 = std::__cxx11::stoi((string *)&tm,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&tm);
  tm._0_8_ = &tm.tm_mon;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tm,buf + 0xd,buf + 0xf);
  iVar4 = std::__cxx11::stoi((string *)&tm,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&tm);
  tm._0_8_ = &tm.tm_mon;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tm,buf + 0xf,buf + 0x11);
  iVar5 = std::__cxx11::stoi((string *)&tm,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&tm);
  tm._0_8_ = &tm.tm_mon;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tm);
  iVar6 = std::__cxx11::stoi((string *)&tm,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&tm);
  tm.tm_wday = 0;
  tm.tm_yday = 0;
  tm.tm_zone = (char *)0x0;
  tm.tm_isdst = 0;
  tm._36_4_ = 0;
  tm.tm_gmtoff = 0;
  tm.tm_sec = 0;
  tm.tm_min = 0;
  tm.tm_hour = 0;
  tm.tm_mday = 0;
  tm._16_8_ = (ulong)(iVar2 + 100) << 0x20;
  tVar7 = mktime((tm *)&tm);
  (this->time).tv_sec = iVar6 + tVar7 + (long)((iVar5 + (iVar4 + iVar3 * 0x18) * 0x3c) * 0x3c);
  (this->time).tv_nsec = 0;
  if (len == 0x13) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_8c[0] = '[';
    local_8c[1] = '\0';
    local_8c[2] = '\0';
    local_8c[3] = '\0';
    util::str<char[42],char[85],char[2],int>
              ((string *)&tm,(util *)"Assertion `(len - nread) >= n` failed at ",
               (char (*) [42])
               "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
               ,(char (*) [85])":",(char (*) [2])local_8c,in_R9);
    std::runtime_error::runtime_error(prVar8,(string *)&tm);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->failure = buf[0x13];
  uVar9 = len & 0xfffffffffffffffe;
  if (uVar9 == 0x14) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_8c[0] = 'c';
    local_8c[1] = '\0';
    local_8c[2] = '\0';
    local_8c[3] = '\0';
    util::str<char[42],char[85],char[2],int>
              ((string *)&tm,(util *)"Assertion `(len - nread) >= n` failed at ",
               (char (*) [42])
               "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
               ,(char (*) [85])":",(char (*) [2])local_8c,in_R9);
    std::runtime_error::runtime_error(prVar8,(string *)&tm);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tm._0_8_ = &tm.tm_mon;
  pcVar1 = buf + 0x16;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tm,buf + 0x14,pcVar1);
  iVar2 = std::__cxx11::stoi((string *)&tm,(size_t *)0x0,10);
  this->signalStrength = iVar2;
  std::__cxx11::string::~string((string *)&tm);
  if (uVar9 == 0x16) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_8c[0] = 'k';
    local_8c[1] = '\0';
    local_8c[2] = '\0';
    local_8c[3] = '\0';
    util::str<char[42],char[85],char[2],int>
              ((string *)&tm,(util *)"Assertion `(len - nread) >= n` failed at ",
               (char (*) [42])
               "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
               ,(char (*) [85])":",(char (*) [2])local_8c,in_R9);
    std::runtime_error::runtime_error(prVar8,(string *)&tm);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((*pcVar1 == '-') || (*pcVar1 == '+')) && (buf[0x17] == 'A')) {
    this->frequencyOffset = 0;
  }
  else {
    tm._0_8_ = &tm.tm_mon;
    std::__cxx11::string::_M_construct<char_const*>((string *)&tm,pcVar1,buf + 0x18);
    iVar2 = std::__cxx11::stoi((string *)&tm,(size_t *)0x0,10);
    this->frequencyOffset = iVar2;
    std::__cxx11::string::~string((string *)&tm);
  }
  if (len == 0x18) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_8c[0] = 'x';
    local_8c[1] = '\0';
    local_8c[2] = '\0';
    local_8c[3] = '\0';
    util::str<char[42],char[85],char[2],int>
              ((string *)&tm,(util *)"Assertion `(len - nread) >= n` failed at ",
               (char (*) [42])
               "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
               ,(char (*) [85])":",(char (*) [2])local_8c,in_R9);
    std::runtime_error::runtime_error(prVar8,(string *)&tm);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->modulationIndex = buf[0x18];
  if (len == 0x19) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_8c[0] = -0x80;
    local_8c[1] = '\0';
    local_8c[2] = '\0';
    local_8c[3] = '\0';
    util::str<char[42],char[85],char[2],int>
              ((string *)&tm,(util *)"Assertion `(len - nread) >= n` failed at ",
               (char (*) [42])
               "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
               ,(char (*) [85])":",(char (*) [2])local_8c,in_R9);
    std::runtime_error::runtime_error(prVar8,(string *)&tm);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->dataQuality = buf[0x19];
  if (len - 0x1d < 0xfffffffffffffffd) {
    tm._0_8_ = &tm.tm_mon;
    std::__cxx11::string::_M_construct<char_const*>((string *)&tm,buf + 0x1a,buf + 0x1d);
    iVar2 = std::__cxx11::stoi((string *)&tm,(size_t *)0x0,10);
    this->receiveChannel = iVar2;
    std::__cxx11::string::~string((string *)&tm);
    if (len == 0x1d) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_8c[0] = -0x70;
      local_8c[1] = '\0';
      local_8c[2] = '\0';
      local_8c[3] = '\0';
      util::str<char[42],char[85],char[2],int>
                ((string *)&tm,(util *)"Assertion `(len - nread) >= n` failed at ",
                 (char (*) [42])
                 "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
                 ,(char (*) [85])":",(char (*) [2])local_8c,in_R9);
      std::runtime_error::runtime_error(prVar8,(string *)&tm);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->spacecraft = buf[0x1d];
    if (uVar9 != 0x1e) {
      *(undefined2 *)this->dataSourceCode = *(undefined2 *)(buf + 0x1e);
      if (len - 0x25 < 0xfffffffffffffffb) {
        tm._0_8_ = &tm.tm_mon;
        std::__cxx11::string::_M_construct<char_const*>((string *)&tm,buf + 0x20,buf + 0x25);
        iVar2 = std::__cxx11::stoi((string *)&tm,(size_t *)0x0,10);
        this->dataLength = iVar2;
        std::__cxx11::string::~string((string *)&tm);
        return 0x25;
      }
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_8c[0] = -0x60;
      local_8c[1] = '\0';
      local_8c[2] = '\0';
      local_8c[3] = '\0';
      util::str<char[42],char[85],char[2],int>
                ((string *)&tm,(util *)"Assertion `(len - nread) >= n` failed at ",
                 (char (*) [42])
                 "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
                 ,(char (*) [85])":",(char (*) [2])local_8c,in_R9);
      std::runtime_error::runtime_error(prVar8,(string *)&tm);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_8c[0] = -0x68;
    local_8c[1] = '\0';
    local_8c[2] = '\0';
    local_8c[3] = '\0';
    util::str<char[42],char[85],char[2],int>
              ((string *)&tm,(util *)"Assertion `(len - nread) >= n` failed at ",
               (char (*) [42])
               "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
               ,(char (*) [85])":",(char (*) [2])local_8c,in_R9);
    std::runtime_error::runtime_error(prVar8,(string *)&tm);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_8c[0] = -0x78;
  local_8c[1] = '\0';
  local_8c[2] = '\0';
  local_8c[3] = '\0';
  util::str<char[42],char[85],char[2],int>
            ((string *)&tm,(util *)"Assertion `(len - nread) >= n` failed at ",
             (char (*) [42])
             "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc",
             (char (*) [85])":",(char (*) [2])local_8c,in_R9);
  std::runtime_error::runtime_error(prVar8,(string *)&tm);
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int Header::readFrom(const char* buf, size_t len) {
  size_t nread = 0;

  // 8 hex digit DCP Address
  {
    constexpr unsigned n = 8;
    ASSERT((len - nread) >= 8);
    auto rv = sscanf(buf + nread, "%08lx", &address);
    ASSERT(rv == 1);
    nread += n;
  }

  // YYDDDHHMMSS – Time the message arrived at the Wallops receive station.
  // The day is represented as a three digit day of the year (julian day).
  {
    constexpr unsigned n = 11;
    ASSERT((len - nread) >= n);
    auto year = std::stoi(std::string(buf + nread, 2), nullptr, 10);
    nread += 2;
    auto day = std::stoi(std::string(buf + nread, 3), nullptr, 10);
    nread += 3;
    auto hour = std::stoi(std::string(buf + nread, 2), nullptr, 10);
    nread += 2;
    auto minute = std::stoi(std::string(buf + nread, 2), nullptr, 10);
    nread += 2;
    auto second = std::stoi(std::string(buf + nread, 2), nullptr, 10);
    nread += 2;

    struct tm tm;
    memset(&tm, 0, sizeof(tm));

    // The number of years since 1900.
    tm.tm_year = 100 + year;

    // Use offset at beginning of year and add parts
    time.tv_sec = mktime(&tm) + ((((day * 24) + hour) * 60) + minute) * 60 + second;
    time.tv_nsec = 0;
  }

  // 1 character failure code
  {
    constexpr unsigned n = 1;
    ASSERT((len - nread) >= n);
    failure = buf[nread];
    nread += n;
  }

  // 2 decimal digit signal strength
  {
    constexpr unsigned n = 2;
    ASSERT((len - nread) >= n);
    signalStrength = std::stoi(std::string(buf + nread, 2));
    nread += n;
  }

  // 2 decimal digit frequency offset
  {
    constexpr unsigned n = 2;
    ASSERT((len - nread) >= n);
    // This can be +A or -A; don't know what it means...
    if ((buf[nread] == '+' || buf[nread] == '-') && buf[nread+1] == 'A') {
      frequencyOffset = 0;
    } else {
      frequencyOffset = std::stoi(std::string(buf + nread, n));
    }
    nread += n;
  }

  // 1 character modulation index
  {
    constexpr unsigned n = 1;
    ASSERT((len - nread) >= n);
    modulationIndex = buf[nread];
    nread += n;
  }

  // 1 character data quality indicator
  {
    constexpr unsigned n = 1;
    ASSERT((len - nread) >= n);
    dataQuality = buf[nread];
    nread += n;
  }

  // 3 decimal digit GOES receive channel
  {
    constexpr unsigned n = 3;
    ASSERT((len - nread) >= n);
    receiveChannel = std::stoi(std::string(buf + nread, n));
    nread += n;
  }

  // 1 character GOES spacecraft indicator ('E' or 'W')
  {
    constexpr unsigned n = 1;
    ASSERT((len - nread) >= n);
    spacecraft = buf[nread];
    nread += n;
  }

  // 2 character data source code Data Source Code Table
  {
    constexpr unsigned n = 2;
    ASSERT((len - nread) >= n);
    memcpy(dataSourceCode, buf + nread, n);
    nread += n;
  }

  // 5 decimal digit message data length
  {
    constexpr unsigned n = 5;
    ASSERT((len - nread) >= n);
    dataLength = std::stoi(std::string(buf + nread, n));
    nread += n;
  }

  return nread;
}